

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::
     print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,long_double_const&,long_double_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,int *args,
               int *args_1,longdouble *args_2,longdouble *args_3)

{
  string_view format_str_00;
  format_args args_00;
  ulong local_48 [2];
  ulong local_38;
  undefined8 local_28;
  undefined2 local_20;
  undefined8 local_18;
  undefined2 local_10;
  
  local_48[0] = (ulong)(uint)*args;
  local_18 = *(undefined8 *)args_3;
  local_38 = (ulong)(uint)*args_1;
  local_28 = *(undefined8 *)args_2;
  local_20 = (undefined2)*(undefined4 *)((long)args_2 + 8);
  local_10 = (undefined2)*(undefined4 *)((long)args_3 + 8);
  format_str_00.size_ = format_str->_M_len;
  format_str_00.data_ = format_str->_M_str;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xbb11;
  vprint(f,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}